

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O0

vector<CScript,_std::allocator<CScript>_> * __thiscall
anon_unknown.dwarf_1ba5289::PKHDescriptor::MakeScripts
          (PKHDescriptor *this,vector<CPubKey,_std::allocator<CPubKey>_> *keys,
          Span<const_CScript> param_3,FlatSigningProvider *out)

{
  map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
  *this_00;
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  *in_RDI;
  long in_R9;
  long in_FS_OFFSET;
  CKeyID id;
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  *in_stack_fffffffffffffec8;
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  *this_01;
  CKeyID *__args;
  CScript *in_stack_ffffffffffffff08;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  __args = (CKeyID *)0x0;
  this_01 = in_RDI;
  std::vector<CPubKey,_std::allocator<CPubKey>_>::operator[]
            ((vector<CPubKey,_std::allocator<CPubKey>_> *)in_RDI,(size_type)in_RDI);
  CPubKey::GetID((CPubKey *)&stack0xffffffffffffffe4);
  this_00 = (map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
             *)(in_R9 + 0x38);
  std::vector<CPubKey,_std::allocator<CPubKey>_>::operator[]
            ((vector<CPubKey,_std::allocator<CPubKey>_> *)this_01,(size_type)in_RDI);
  std::map<CKeyID,CPubKey,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CPubKey>>>::
  emplace<CKeyID&,CPubKey_const&>(this_00,__args,(CPubKey *)this_01);
  PKHash::PKHash((PKHash *)in_stack_fffffffffffffec8,(CKeyID *)0xe86604);
  std::
  variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
  ::variant<PKHash,void,void,PKHash,void>(this_01,(PKHash *)in_RDI);
  GetScriptForDestination(in_stack_fffffffffffffec8);
  Vector<CScript>(in_stack_ffffffffffffff08);
  CScript::~CScript((CScript *)in_stack_fffffffffffffec8);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant(in_stack_fffffffffffffec8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (vector<CScript,_std::allocator<CScript>_> *)this_01;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<CScript> MakeScripts(const std::vector<CPubKey>& keys, Span<const CScript>, FlatSigningProvider& out) const override
    {
        CKeyID id = keys[0].GetID();
        out.pubkeys.emplace(id, keys[0]);
        return Vector(GetScriptForDestination(PKHash(id)));
    }